

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_Create(ktxTextureCreateInfo *createInfo,ktxTextureCreateStorageEnum storageAllocation,
                  ktxTexture1 **newTex)

{
  void *__ptr;
  undefined8 *in_RDX;
  ktxTextureCreateInfo *unaff_retaddr;
  ktxTexture1 *tex;
  ktx_error_code_e result;
  ktxTextureCreateStorageEnum in_stack_fffffffffffffffc;
  ktx_error_code_e kVar1;
  
  if (in_RDX == (undefined8 *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    __ptr = malloc(0x90);
    if (__ptr == (void *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = ktxTexture1_construct(tex,unaff_retaddr,in_stack_fffffffffffffffc);
      if (kVar1 == KTX_SUCCESS) {
        *in_RDX = __ptr;
      }
      else {
        free(__ptr);
      }
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_Create(const ktxTextureCreateInfo* const createInfo,
                   ktxTextureCreateStorageEnum storageAllocation,
                   ktxTexture1** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture1* tex = (ktxTexture1*)malloc(sizeof(ktxTexture1));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture1_construct(tex, createInfo, storageAllocation);
    if (result != KTX_SUCCESS) {
        free(tex);
    } else {
        *newTex = tex;
    }
    return result;
}